

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::analysis::DataFlowState>::cleanup
          (SmallVectorBase<slang::analysis::DataFlowState> *this,EVP_PKEY_CTX *ctx)

{
  pointer p;
  pointer p_00;
  pointer pDVar1;
  
  p_00 = this->data_;
  if (this->len != 0) {
    pDVar1 = p_00 + this->len;
    do {
      p = (p_00->assigned).
          super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>.data_;
      if (p != (pointer)(p_00->assigned).
                        super_SmallVectorBase<slang::IntervalMap<unsigned_long,_std::monostate,_3U>_>
                        .firstElement) {
        operator_delete(p);
      }
      p_00 = p_00 + 1;
    } while (p_00 != pDVar1);
    p_00 = this->data_;
  }
  if (p_00 != (pointer)this->firstElement) {
    operator_delete(p_00);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }